

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void __thiscall
kratos::InsertClockIRVisitor::visit(InsertClockIRVisitor *this,SequentialStmtBlock *block)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  StatementType SVar2;
  Generator *pGVar3;
  uint64_t uVar4;
  element_type *this_01;
  element_type *peVar5;
  element_type *peVar6;
  __shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  StmtBlock *pSVar8;
  __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  element_type *peVar9;
  element_type *peVar10;
  shared_ptr<kratos::Stmt> local_c8;
  undefined1 local_b8 [8];
  shared_ptr<kratos::IfStmt> if__1;
  shared_ptr<kratos::Stmt> local_a0;
  undefined1 local_90 [8];
  shared_ptr<kratos::IfStmt> new_if;
  shared_ptr<kratos::Var> cond;
  undefined1 local_60 [8];
  shared_ptr<kratos::IfStmt> if_;
  shared_ptr<kratos::Stmt> first_stmt;
  shared_ptr<kratos::Port> clk_en;
  Generator *generator;
  uint64_t num_stmts;
  Generator *gen;
  SequentialStmtBlock *block_local;
  InsertClockIRVisitor *this_local;
  
  if (this->clk_en_ == (Port *)0x0) {
    return;
  }
  bVar1 = has_don_touch((IRNode *)block);
  if (bVar1) {
    return;
  }
  pGVar3 = Stmt::generator_parent((Stmt *)block);
  bVar1 = has_don_touch(&pGVar3->super_IRNode);
  if (bVar1) {
    return;
  }
  uVar4 = StmtBlock::size(&block->super_StmtBlock);
  pGVar3 = Stmt::generator_parent((Stmt *)block);
  Generator::get_port((Generator *)
                      &first_stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(string *)pGVar3);
  if (uVar4 != 0) {
    StmtBlock::get_stmt((StmtBlock *)
                        &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,(uint64_t)block);
    if (uVar4 == 1) {
      this_01 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
      SVar2 = Stmt::type(this_01);
      if (SVar2 != If) goto LAB_003eaa29;
      std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      Stmt::as<kratos::IfStmt>((Stmt *)local_60);
      std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 local_60);
      this_00 = &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      IfStmt::predicate((IfStmt *)this_00);
      peVar5 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)this_00);
      bVar1 = has_port_type(peVar5,AsyncReset);
      if (bVar1) {
LAB_003ea87f:
        peVar6 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_60);
        p_Var7 = &IfStmt::else_body(peVar6)->
                  super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
        pSVar8 = &std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                            (p_Var7)->super_StmtBlock;
        bVar1 = has_clk_en_stmt(this,pSVar8);
        if (!bVar1) {
          peVar6 = std::
                   __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_60);
          p_Var7 = &IfStmt::else_body(peVar6)->
                    super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
          pSVar8 = &std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                              (p_Var7)->super_StmtBlock;
          peVar10 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&first_stmt.
                                    super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
          create_if_stmt_wrapper((kratos *)local_90,pSVar8,peVar10,true);
          peVar6 = std::
                   __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_60);
          this_02 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)IfStmt::else_body(peVar6);
          peVar9 = std::
                   __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(this_02);
          (*(peVar9->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xc])();
          peVar6 = std::
                   __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_60);
          std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
                    (&local_a0,(shared_ptr<kratos::IfStmt> *)local_90);
          IfStmt::add_else_stmt(peVar6,&local_a0);
          std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_a0);
          std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_90);
        }
        if__1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
             = 1;
      }
      else {
        peVar5 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                            &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
        bVar1 = has_port_type(peVar5,Reset);
        if (bVar1) goto LAB_003ea87f;
        if__1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
             = 0;
      }
      std::shared_ptr<kratos::Var>::~shared_ptr
                ((shared_ptr<kratos::Var> *)
                 &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_60);
      if (if__1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ == 0) goto LAB_003eaa29;
    }
    else {
LAB_003eaa29:
      bVar1 = has_clk_en_stmt(this,&block->super_StmtBlock);
      if (!bVar1) {
        peVar10 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator*((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&first_stmt.
                                super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
        create_if_stmt_wrapper((kratos *)local_b8,&block->super_StmtBlock,peVar10,true);
        (*(block->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xc])();
        std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
                  (&local_c8,(shared_ptr<kratos::IfStmt> *)local_b8);
        StmtBlock::add_stmt(&block->super_StmtBlock,&local_c8);
        std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_c8);
        std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_b8);
      }
      if__1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           0;
    }
    std::shared_ptr<kratos::Stmt>::~shared_ptr
              ((shared_ptr<kratos::Stmt> *)
               &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (if__1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
        != 0) goto LAB_003eab58;
  }
  if__1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
LAB_003eab58:
  std::shared_ptr<kratos::Port>::~shared_ptr
            ((shared_ptr<kratos::Port> *)
             &first_stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void visit(SequentialStmtBlock* block) override {
        if (!clk_en_) return;
        if (has_don_touch(block)) return;
        auto* gen = block->generator_parent();
        if (has_don_touch(gen)) return;
        auto num_stmts = block->size();
        auto* generator = block->generator_parent();
        auto clk_en = generator->get_port(clk_en_name_);
        if (num_stmts > 0) {
            // we need to be careful about async reset logic
            auto first_stmt = block->get_stmt(0);
            if (num_stmts == 1 && first_stmt->type() == StatementType::If) {
                // async reset?
                auto if_ = first_stmt->as<IfStmt>();
                auto cond = if_->predicate();
                if (has_port_type(cond.get(), PortType::AsyncReset) ||
                    has_port_type(cond.get(), PortType::Reset)) {
                    if (!has_clk_en_stmt(if_->else_body().get())) {
                        auto new_if = create_if_stmt_wrapper(if_->else_body().get(), *clk_en, true);
                        if_->else_body()->clear();
                        if_->add_else_stmt(new_if);
                    }
                    return;
                }
            }
            // put everything into one block
            // if not clk enabled already
            if (!has_clk_en_stmt(block)) {
                auto if_ = create_if_stmt_wrapper(block, *clk_en, true);
                block->clear();
                block->add_stmt(if_);
            }
        }
    }